

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char____char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,void *pos,undefined8 branchIndex,undefined8 *first,size_t *rest,
          undefined8 *rest_1,undefined8 rest_2,undefined8 rest_3,undefined8 rest_4,undefined8 rest_5
          ,undefined8 rest_6,undefined8 rest_7,undefined8 rest_8,undefined8 rest_9,
          undefined8 rest_10,undefined8 rest_11,undefined8 rest_12,undefined8 rest_13,
          undefined8 rest_14,undefined8 rest_15,undefined8 rest_16,undefined8 rest_17,
          undefined8 rest_18,undefined8 rest_19,undefined8 rest_20,undefined8 rest_21,
          undefined8 rest_22,undefined8 rest_23,undefined8 rest_24,undefined8 rest_25,
          undefined8 rest_26,undefined8 rest_27,undefined8 rest_28,undefined8 rest_29,
          undefined8 rest_30,undefined8 rest_31,undefined8 rest_32,undefined8 rest_33,
          undefined8 rest_34,undefined8 rest_35,undefined8 rest_36,undefined8 rest_37,
          undefined8 rest_38,undefined8 rest_39,undefined8 rest_40,undefined8 rest_41,
          undefined8 rest_42,undefined8 rest_43,undefined8 rest_44,undefined8 rest_45,
          undefined8 rest_46,undefined8 rest_47,undefined8 rest_48,undefined8 rest_49,
          undefined8 rest_50,undefined8 rest_51,undefined8 rest_52,undefined8 rest_53,
          undefined8 rest_54,undefined8 rest_55,undefined8 rest_56,undefined8 rest_57,
          undefined8 rest_58,undefined8 rest_59,undefined8 rest_60,undefined8 rest_61,
          undefined8 rest_62,undefined8 rest_63)

{
  size_t sVar1;
  undefined8 in_stack_000001f8;
  undefined8 in_stack_00000200;
  undefined8 in_stack_00000208;
  
  sVar1 = first[1];
  if (sVar1 != 0) {
    memcpy(pos,(void *)*first,sVar1);
    pos = (void *)((long)pos + sVar1);
  }
  sVar1 = *rest;
  if (sVar1 != 0) {
    memcpy(pos,rest + 1,sVar1);
    pos = (void *)((long)pos + sVar1);
  }
  sVar1 = rest_1[1];
  if (sVar1 != 0) {
    memcpy(pos,(void *)*rest_1,sVar1);
    pos = (void *)((long)pos + sVar1);
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayP___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
            (this,pos,branchIndex,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9,rest_10,
             rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,rest_20,rest_21
             ,rest_22,rest_23,rest_24,rest_25,rest_26,rest_27,rest_28,rest_29,rest_30,rest_31,
             rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,rest_41,rest_42
             ,rest_43,rest_44,rest_45,rest_46,rest_47,rest_48,rest_49,rest_50,rest_51,rest_52,
             rest_53,rest_54,rest_55,rest_56,rest_57,rest_58,rest_59,rest_60,rest_61,rest_62,rest_63
             ,in_stack_000001f8,in_stack_00000200,in_stack_00000208);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}